

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000018b2a0 = 0x2e2e2e2e2e2e2e;
    uRam000000000018b2a7._0_1_ = '.';
    uRam000000000018b2a7._1_1_ = '.';
    uRam000000000018b2a7._2_1_ = '.';
    uRam000000000018b2a7._3_1_ = '.';
    uRam000000000018b2a7._4_1_ = '.';
    uRam000000000018b2a7._5_1_ = '.';
    uRam000000000018b2a7._6_1_ = '.';
    uRam000000000018b2a7._7_1_ = '.';
    DAT_0018b290 = '.';
    DAT_0018b290_1._0_1_ = '.';
    DAT_0018b290_1._1_1_ = '.';
    DAT_0018b290_1._2_1_ = '.';
    DAT_0018b290_1._3_1_ = '.';
    DAT_0018b290_1._4_1_ = '.';
    DAT_0018b290_1._5_1_ = '.';
    DAT_0018b290_1._6_1_ = '.';
    uRam000000000018b298 = 0x2e2e2e2e2e2e2e;
    DAT_0018b29f = 0x2e;
    DAT_0018b280 = '.';
    DAT_0018b280_1._0_1_ = '.';
    DAT_0018b280_1._1_1_ = '.';
    DAT_0018b280_1._2_1_ = '.';
    DAT_0018b280_1._3_1_ = '.';
    DAT_0018b280_1._4_1_ = '.';
    DAT_0018b280_1._5_1_ = '.';
    DAT_0018b280_1._6_1_ = '.';
    uRam000000000018b288._0_1_ = '.';
    uRam000000000018b288._1_1_ = '.';
    uRam000000000018b288._2_1_ = '.';
    uRam000000000018b288._3_1_ = '.';
    uRam000000000018b288._4_1_ = '.';
    uRam000000000018b288._5_1_ = '.';
    uRam000000000018b288._6_1_ = '.';
    uRam000000000018b288._7_1_ = '.';
    DAT_0018b270 = '.';
    DAT_0018b270_1._0_1_ = '.';
    DAT_0018b270_1._1_1_ = '.';
    DAT_0018b270_1._2_1_ = '.';
    DAT_0018b270_1._3_1_ = '.';
    DAT_0018b270_1._4_1_ = '.';
    DAT_0018b270_1._5_1_ = '.';
    DAT_0018b270_1._6_1_ = '.';
    uRam000000000018b278._0_1_ = '.';
    uRam000000000018b278._1_1_ = '.';
    uRam000000000018b278._2_1_ = '.';
    uRam000000000018b278._3_1_ = '.';
    uRam000000000018b278._4_1_ = '.';
    uRam000000000018b278._5_1_ = '.';
    uRam000000000018b278._6_1_ = '.';
    uRam000000000018b278._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000018b268._0_1_ = '.';
    uRam000000000018b268._1_1_ = '.';
    uRam000000000018b268._2_1_ = '.';
    uRam000000000018b268._3_1_ = '.';
    uRam000000000018b268._4_1_ = '.';
    uRam000000000018b268._5_1_ = '.';
    uRam000000000018b268._6_1_ = '.';
    uRam000000000018b268._7_1_ = '.';
    DAT_0018b2af = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}